

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdir-posix.c
# Opt level: O0

pboolean p_dir_rewind(PDir *dir,PError **error)

{
  bool bVar1;
  PError **error_local;
  PDir *dir_local;
  
  bVar1 = true;
  if (dir != (PDir *)0x0) {
    bVar1 = dir->dir == (DIR *)0x0;
  }
  if (!bVar1) {
    rewinddir((DIR *)dir->dir);
  }
  else {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
  }
  dir_local._4_4_ = (uint)!bVar1;
  return dir_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_dir_rewind (PDir	*dir,
	      PError	**error)
{
	if (P_UNLIKELY (dir == NULL || dir->dir == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	rewinddir (dir->dir);

	return TRUE;
}